

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O2

void * arena_slab_reg_alloc(extent_t *slab,bin_info_t *bin_info)

{
  ulong *puVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_64_2_5a3fc52c_for_extent_s_8 *paVar6;
  ulong uVar7;
  
  uVar5 = 0;
  uVar4 = 1;
  paVar6 = &slab->field_5;
  while (uVar7 = (paVar6->e_slab_data).bitmap[0], uVar7 == 0) {
    uVar7 = (ulong)uVar4;
    uVar5 = uVar5 + 0x40;
    uVar4 = uVar4 + 1;
    paVar6 = (anon_union_64_2_5a3fc52c_for_extent_s_8 *)((long)&slab->field_5 + uVar7 * 8);
  }
  uVar3 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  puVar1 = (ulong *)((long)&slab->field_5 + (ulong)(uVar5 >> 3));
  *puVar1 = *puVar1 ^ 1L << ((byte)uVar3 & 0x3f);
  sVar2 = bin_info->reg_size;
  slab->e_bits = slab->e_bits - 0x4000000;
  return (void *)((uVar5 | uVar3) * sVar2 + (long)slab->e_addr);
}

Assistant:

static inline arena_slab_data_t *
extent_slab_data_get(extent_t *extent) {
	assert(extent_slab_get(extent));
	return &extent->e_slab_data;
}